

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O0

Writer * __thiscall xe::xml::Writer::operator<<(Writer *this,BeginElement *begin)

{
  size_type sVar1;
  ostream *poVar2;
  int local_1c;
  int i;
  BeginElement *begin_local;
  Writer *this_local;
  
  if (this->m_state == STATE_ELEMENT) {
    std::operator<<(this->m_rawDst,">");
  }
  if ((this->m_state == STATE_ELEMENT) || (this->m_state == STATE_ELEMENT_END)) {
    std::operator<<(this->m_rawDst,"\n");
    for (local_1c = 0;
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->m_elementStack), local_1c < (int)sVar1; local_1c = local_1c + 1) {
      std::operator<<(this->m_rawDst,"  ");
    }
  }
  poVar2 = std::operator<<(this->m_rawDst,"<");
  std::operator<<(poVar2,(string *)begin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_elementStack,&begin->element);
  this->m_state = STATE_ELEMENT;
  return this;
}

Assistant:

Writer& Writer::operator<< (const BeginElement& begin)
{
	if (m_state == STATE_ELEMENT)
		m_rawDst << ">";

	if (m_state == STATE_ELEMENT || m_state == STATE_ELEMENT_END)
	{
		m_rawDst << "\n";
		for (int i = 0; i < (int)m_elementStack.size(); i++)
			m_rawDst << "  ";
	}

	m_rawDst << "<" << begin.element;

	m_elementStack.push_back(begin.element);
	m_state = STATE_ELEMENT;

	return *this;
}